

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Cba_ManWriteVerilog(char *pFileName,Cba_Man_t *p,int fInlineConcat)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  Cba_Ntk_t *p_00;
  FILE *__s;
  FILE *pFile;
  int i;
  Cba_Ntk_t *pNtk;
  int fInlineConcat_local;
  Cba_Man_t *p_local;
  char *pFileName_local;
  
  if ((p->pMioLib == (void *)0x0) ||
     (pvVar1 = p->pMioLib, pvVar3 = Abc_FrameReadLibGen(), pvVar1 == pvVar3)) {
    Cba_ManCreatePrimMap(p->pTypeNames);
    p->nOpens = 1;
    Vec_StrClear(&p->vOut);
    Vec_StrClear(&p->vOut2);
    Vec_StrPrintStr(&p->vOut,"// Design \"");
    pcVar4 = Cba_ManName(p);
    Vec_StrPrintStr(&p->vOut,pcVar4);
    Vec_StrPrintStr(&p->vOut,"\" written via CBA package in ABC on ");
    pcVar4 = Extra_TimeStamp();
    Vec_StrPrintStr(&p->vOut,pcVar4);
    Vec_StrPrintStr(&p->vOut,"\n\n");
    for (pFile._4_4_ = 1; iVar2 = Cba_ManNtkNum(p), pFile._4_4_ <= iVar2;
        pFile._4_4_ = pFile._4_4_ + 1) {
      p_00 = Cba_ManNtk(p,pFile._4_4_);
      Cba_ManWriteVerilogNtk(p_00,fInlineConcat);
    }
    iVar2 = Vec_StrSize(&p->vOut);
    if (0 < iVar2) {
      __s = fopen(pFileName,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",pFileName);
      }
      else {
        pcVar4 = Vec_StrArray(&p->vOut);
        iVar2 = Vec_StrSize(&p->vOut);
        fwrite(pcVar4,1,(long)iVar2,__s);
        fclose(__s);
      }
    }
  }
  else {
    printf("Genlib library used in the mapped design is not longer a current library.\n");
  }
  return;
}

Assistant:

void Cba_ManWriteVerilog( char * pFileName, Cba_Man_t * p, int fInlineConcat )
{
    Cba_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    Cba_ManCreatePrimMap( p->pTypeNames );
    // derive the stream
    p->nOpens = 1;
    Vec_StrClear( &p->vOut );
    Vec_StrClear( &p->vOut2 );
    Vec_StrPrintStr( &p->vOut, "// Design \"" );
    Vec_StrPrintStr( &p->vOut, Cba_ManName(p) );
    Vec_StrPrintStr( &p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( &p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( &p->vOut, "\n\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteVerilogNtk( pNtk, fInlineConcat );
    // dump into file
    if ( Vec_StrSize(&p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(&p->vOut), 1, Vec_StrSize(&p->vOut), pFile );
            fclose( pFile );
        }
    }
}